

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/string_object.cpp:285:67)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_string_object_cpp:285:67)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  void *pvVar1;
  uint *puVar2;
  native_error_exception *this_00;
  global_object *this_01;
  wstring_view s_00;
  string s;
  wstring local_208;
  wstring_view local_1e8 [2];
  wstring_view local_1c8;
  string_view local_1b8;
  gc_heap_ptr_untyped local_1a8 [23];
  
  if (null < this_->type_) {
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
    h = *(gc_heap **)((long)pvVar1 + 8);
    to_string((mjs *)local_1a8,h,this_);
    puVar2 = (uint *)gc_heap_ptr_untyped::get(local_1a8);
    s_00._M_str = (wchar_t *)(puVar2 + 1);
    s_00._M_len = (ulong)*puVar2;
    local_1e8[0] = trim(s_00,(this->f).ver);
    string::string((string *)&local_208,h,local_1e8);
    __return_storage_ptr__->type_ = string;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = (gc_heap *)local_208._M_dataplus._M_p;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) =
         (undefined4)local_208._M_string_length;
    if ((gc_heap *)local_208._M_dataplus._M_p != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_208._M_dataplus._M_p,
                      (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_208);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(local_1a8);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"String.prototype.trim cannot be called on ",0x2a);
  mjs::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,this_->type_);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  this_01 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::stack_trace_abi_cxx11_(&local_208,this_01);
  local_1c8._M_str = local_208._M_dataplus._M_p;
  std::__cxx11::stringbuf::str();
  local_1b8._M_len = (size_t)local_1e8[0]._M_str;
  local_1b8._M_str = (char *)local_1e8[0]._M_len;
  native_error_exception::native_error_exception(this_00,type,&local_1c8,&local_1b8);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }